

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsCell.cpp
# Opt level: O2

void __thiscall KDReports::Cell::build(Cell *this,ReportBuilder *builder)

{
  CellPrivate *pCVar1;
  long lVar2;
  ElementData *pEVar3;
  long lVar4;
  undefined4 local_40;
  undefined2 local_3c;
  undefined8 local_3a;
  
  pCVar1 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::CellPrivate,_std::default_delete<KDReports::CellPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::CellPrivate_*,_std::default_delete<KDReports::CellPrivate>_>
           .super__Head_base<0UL,_KDReports::CellPrivate_*,_false>._M_head_impl;
  lVar2 = (pCVar1->m_elements).d.size;
  pEVar3 = (pCVar1->m_elements).d.ptr;
  for (lVar4 = 0; lVar2 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
    switch((&pEVar3->field_0x8)[lVar4] & 7) {
    case 0:
      (*builder->_vptr_ReportBuilder[8])(builder,*(undefined8 *)((long)&pEVar3->m_element + lVar4));
      break;
    case 1:
      local_40 = 0;
      local_3c = 0xffff;
      local_3a = 0;
      (*builder->_vptr_ReportBuilder[9])
                (builder,*(undefined8 *)((long)&pEVar3->m_element + lVar4),
                 (ulong)*(uint *)((long)&pEVar3->field_2 + lVar4),&local_40);
      break;
    case 2:
      (*builder->_vptr_ReportBuilder[10])(builder,(ulong)*(uint *)((long)&pEVar3->field_2 + lVar4));
      break;
    case 3:
      (*builder->_vptr_ReportBuilder[0xb])(*(undefined8 *)((long)&pEVar3->field_2 + lVar4),builder);
    }
  }
  return;
}

Assistant:

void KDReports::Cell::build(ReportBuilder &builder) const
{
    for (const KDReports::ElementData &ed : std::as_const(d->m_elements)) {
        switch (ed.m_type) {
        case KDReports::ElementData::Inline:
            builder.addInlineElement(*ed.m_element);
            break;
        case KDReports::ElementData::Block:
            builder.addBlockElement(*ed.m_element, ed.m_align);
            break;
        case KDReports::ElementData::Variable:
            builder.addVariable(ed.m_variableType);
            break;
        case KDReports::ElementData::VerticalSpacing:
            builder.addVerticalSpacing(ed.m_value);
            break;
        }
    }
}